

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O2

void __thiscall
QHttpThreadDelegate::synchronousAuthenticationRequiredSlot
          (QHttpThreadDelegate *this,QHttpNetworkRequest *request,QAuthenticator *a)

{
  QNetworkAccessAuthenticationManager *this_00;
  long in_FS_OFFSET;
  QNetworkAuthenticationCredential credential;
  undefined1 local_80 [16];
  undefined1 *puStack_70;
  undefined1 *local_68;
  QString QStack_60;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x150) != 0) {
    local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QStack_60.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QStack_60.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    QStack_60.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_80._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    this_00 = *(QNetworkAccessAuthenticationManager **)(this + 0x78);
    QHttpNetworkRequest::url((QHttpNetworkRequest *)local_80);
    QNetworkAccessAuthenticationManager::fetchCachedCredentials
              ((QNetworkAuthenticationCredential *)(local_80 + 8),this_00,(QUrl *)local_80,a);
    QUrl::~QUrl((QUrl *)local_80);
    if (((puStack_70 != (undefined1 *)0x0) || (QStack_60.d.ptr != (char16_t *)0x0)) ||
       (local_48.d.ptr != (char16_t *)0x0)) {
      QAuthenticator::setUser(a,&QStack_60);
      QAuthenticator::setPassword(a,&local_48);
    }
    QObject::disconnect(*(QObject **)(this + 0x150),
                        "2authenticationRequired(QHttpNetworkRequest,QAuthenticator*)",
                        (QObject *)this,
                        "1synchronousAuthenticationRequiredSlot(QHttpNetworkRequest,QAuthenticator*)"
                       );
    QNetworkAuthenticationCredential::~QNetworkAuthenticationCredential
              ((QNetworkAuthenticationCredential *)(local_80 + 8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::synchronousAuthenticationRequiredSlot(const QHttpNetworkRequest &request, QAuthenticator *a)
{
    if (!httpReply)
        return;

    Q_UNUSED(request);
#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::synchronousAuthenticationRequiredSlot() thread=" << QThread::currentThreadId();
#endif

    // Ask the credential cache
    QNetworkAuthenticationCredential credential = authenticationManager->fetchCachedCredentials(httpRequest.url(), a);
    if (!credential.isNull()) {
        a->setUser(credential.user);
        a->setPassword(credential.password);
    }

    // Disconnect this connection now since we only want to ask the authentication cache once.
    QObject::disconnect(httpReply, SIGNAL(authenticationRequired(QHttpNetworkRequest,QAuthenticator*)),
        this, SLOT(synchronousAuthenticationRequiredSlot(QHttpNetworkRequest,QAuthenticator*)));
}